

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD
          (ChFunctionRotation_SQUAD *this,
          vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
          *mrotations,ChVectorDynamic<> *mknots)

{
  undefined4 local_3c;
  __shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2> local_38;
  undefined8 local_28;
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_SQUAD_01192f28;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->closed = false;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->rotations =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>)
       SUB3224(ZEXT432(0) << 0x40,0);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)SUB328(ZEXT432(0) << 0x40,0x18);
  SetupData(this,mrotations,mknots);
  local_3c = 0;
  local_28 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Ramp,int,double>((int *)&local_38,(double *)&local_3c);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->space_fx,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD(
		const std::vector<ChQuaternion<> >& mrotations,  ///< control points, size n. Required: at least n >= p+1
		ChVectorDynamic<>* mknots           ///< knots, size k. Required k=n+p+1. If not provided, initialized to uniform.
	) {
		this->closed = false;
		this->SetupData(mrotations, mknots);

		// default s(t) function. User will provide better fx.
		space_fx = chrono_types::make_shared<ChFunction_Ramp>(0, 1.);
	}